

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double benchmark_processing<boost::poly_collection::base_collection<A,std::allocator<A>>>
                 (size_t num_elems)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  __node_base _Var6;
  long lVar7;
  undefined1 auVar8 [16];
  uniform_int_distribution<int> rnd_type;
  base_collection<A,_std::allocator<A>_> container;
  mt19937_64 gen;
  random_device rd;
  double local_1e18;
  param_type local_1e00;
  base_collection<A,_std::allocator<A>_> local_1df8;
  uniform_real_distribution<double> local_1d88;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d78;
  random_device local_13b0;
  
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_buckets =
       &local_1df8.
        super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map
        .map._M_h._M_single_bucket;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_bucket_count = 1;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_element_count = 0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_rehash_policy._M_next_resize = 0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.map.
  _M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_buckets =
       &local_1df8.
        super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map
        .cache._M_h._M_single_bucket;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_bucket_count = 1;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_element_count = 0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_rehash_policy._M_next_resize = 0;
  local_1df8.
  super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.cache
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::random_device::random_device(&local_13b0);
  uVar1 = std::random_device::_M_getval();
  local_1d78._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar5 = local_1d78._M_x[0];
  do {
    uVar5 = (uVar5 >> 0x3e ^ uVar5) * 0x5851f42d4c957f2d + lVar2;
    local_1d78._M_x[lVar2] = uVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_1d78._M_p = 0x138;
  local_1e00._M_a = 0;
  local_1e00._M_b = 5;
  local_1d88._M_param._M_a = 0.0;
  local_1d88._M_param._M_b = 100000.0;
  random_fill<boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
            (&local_1df8,&local_1d78,(uniform_int_distribution<int> *)&local_1e00,&local_1d88,
             num_elems);
  lVar2 = std::chrono::_V2::system_clock::now();
  process<A>(&local_1df8);
  lVar3 = std::chrono::_V2::system_clock::now();
  if (local_1df8.
      super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map.
      map._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    local_1e18 = 0.0;
  }
  else {
    lVar7 = 0;
    _Var6._M_nxt = local_1df8.
                   super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
                   .map.map._M_h._M_before_begin._M_nxt;
    do {
      lVar4 = (*(code *)(_Var6._M_nxt[3]._M_nxt)->_M_nxt[0xb]._M_nxt)();
      lVar7 = lVar7 + lVar4;
      _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
    } while (_Var6._M_nxt != (_Hash_node_base *)0x0);
    auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = 0x45300000;
    local_1e18 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  }
  do_not_optimize_out<A>(&local_1df8);
  std::random_device::_M_fini();
  std::
  _Hashtable<const_std::type_info_*,_std::pair<const_std::type_info_*const,_std::__detail::_Node_iterator<std::pair<const_std::type_info_*const,_boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>,_false,_false>_>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<std::pair<const_std::type_info_*const,_std::__detail::_Node_iterator<std::pair<const_std::type_info_*const,_boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>,_false,_false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_std::type_info_*>,_std::hash<const_std::type_info_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1df8.
                 super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
                 .map.cache._M_h);
  std::
  _Hashtable<const_std::type_info_*,_std::pair<const_std::type_info_*const,_boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<std::pair<const_std::type_info_*const,_boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>_>_>,_std::__detail::_Select1st,_boost::poly_collection::detail::type_info_ptr_equal_to,_boost::poly_collection::detail::type_info_ptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_std::type_info_*,_std::pair<const_std::type_info_*const,_boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<std::pair<const_std::type_info_*const,_boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>_>_>,_std::__detail::_Select1st,_boost::poly_collection::detail::type_info_ptr_equal_to,_boost::poly_collection::detail::type_info_ptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_1df8);
  return ((double)(lVar3 - lVar2) / 1000000000.0) / local_1e18;
}

Assistant:

double benchmark_processing( std::size_t num_elems)
{
	Cont container;

        //std::cout << "p";
        std::random_device rd;
        std::mt19937_64					gen(rd());
	std::uniform_int_distribution<>			rnd_type(0, 5 );
	std::uniform_real_distribution<double>	rnd_value(0, 100000);
	random_fill(container, gen, rnd_type, rnd_value, num_elems);

	auto start = tic();
	{
		process(container);
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}